

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 141_linkedListCycle.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ListNode *this;
  ListNode *head;
  int x;
  
  this = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this,10);
  this->val = 1;
  this->next = this;
  bVar1 = hasCycle(this);
  std::ostream::operator<<((ostream *)&std::cout,bVar1);
  return 0;
}

Assistant:

int main()
{
	int x = 10;
	ListNode *head = new ListNode(x);//,*head2(x),*head3(0);
	head->val = 1;
	head->next = head;
	cout << hasCycle(head);
	return 0;
}